

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindandDelete
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S)

{
  pointer pcVar1;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  vector<int,_std::allocator<int>_> *pvStack_b0;
  vector<value,_std::allocator<value>_> *local_a8;
  vector<condition,_std::allocator<condition>_> *pvStack_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<int,_std::allocator<int>_> *pvStack_68;
  vector<value,_std::allocator<value>_> *local_60;
  vector<condition,_std::allocator<condition>_> *pvStack_58;
  _Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_> local_50;
  
  local_98[0] = S->is_select_all;
  pcVar1 = (S->tableName)._M_dataplus._M_p;
  local_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (S->tableName)._M_string_length);
  local_70 = S->colunmList;
  pvStack_68 = S->colunmId;
  local_60 = S->v_list;
  pvStack_58 = S->c_list;
  FindSuchRecord(__return_storage_ptr__,this,(STMT *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  local_e0[0] = S->is_select_all;
  pcVar1 = (S->tableName)._M_dataplus._M_p;
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + (S->tableName)._M_string_length);
  local_b8 = S->colunmList;
  pvStack_b0 = S->colunmId;
  local_a8 = S->v_list;
  pvStack_a0 = S->c_list;
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::_Rb_tree
            (&local_50,&__return_storage_ptr__->_M_t);
  DeleteSuchRecord(this,(STMT *)local_e0,
                   (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)&local_50);
  std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::~_Rb_tree
            (&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

set<Addr> RecordManager::FindandDelete(STMT S) {
	set<Addr> target = this->FindSuchRecord(S);
	this->DeleteSuchRecord(S, target);
	return target;
}